

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_string::data(xpath_string *this,xpath_allocator *alloc)

{
  size_t length;
  char *__s;
  
  __s = this->_buffer;
  if (this->_uses_heap == false) {
    length = strlen(__s);
    __s = duplicate_string(__s,length,alloc);
    if (__s == (char_t *)0x0) {
      __s = (char *)0x0;
    }
    else {
      this->_buffer = __s;
      this->_uses_heap = true;
      this->_length_heap = length;
    }
  }
  return __s;
}

Assistant:

char_t* data(xpath_allocator* alloc)
		{
			// make private heap copy
			if (!_uses_heap)
			{
				size_t length_ = strlength(_buffer);
				const char_t* data_ = duplicate_string(_buffer, length_, alloc);

				if (!data_) return NULL;

				_buffer = data_;
				_uses_heap = true;
				_length_heap = length_;
			}

			return const_cast<char_t*>(_buffer);
		}